

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_Displacement::SubItem_*>::Append
          (ON_SimpleArray<ON_Displacement::SubItem_*> *this,SubItem **x)

{
  SubItem *pSVar1;
  int iVar2;
  void *temp;
  SubItem **ppSStack_20;
  int newcapacity;
  SubItem **p;
  SubItem **x_local;
  ON_SimpleArray<ON_Displacement::SubItem_*> *this_local;
  
  ppSStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      ppSStack_20 = (SubItem **)onmalloc(8);
      *ppSStack_20 = *x;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (SubItem **)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pSVar1 = *ppSStack_20;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  this->m_a[iVar2] = pSVar1;
  if (ppSStack_20 != x) {
    onfree(ppSStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}